

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * __thiscall Pathie::Path::join(Path *__return_storage_ptr__,Path *this,Path *path)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_50,&this->m_path,"/");
  std::__cxx11::string::string((string *)&local_70,(string *)path);
  std::operator+(&local_30,&local_50,&local_70);
  Path(__return_storage_ptr__,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Path Path::join(Path path) const
{
  Path p(m_path + "/" + path.str());
  return p;
}